

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

bool __thiscall
Imath_3_2::Matrix44<double>::equalWithAbsError(Matrix44<double> *this,Matrix44<double> *m,double e)

{
  double dVar1;
  double dVar2;
  int i;
  ulong uVar3;
  int j;
  long lVar4;
  
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    lVar4 = 0;
    while (lVar4 != 4) {
      dVar1 = (*(double (*) [4])*(double (*) [4])this)[lVar4];
      dVar2 = (*(double (*) [4])*(double (*) [4])m)[lVar4];
      lVar4 = lVar4 + 1;
      if (e < (double)(~-(ulong)(dVar2 < dVar1) & (ulong)(dVar2 - dVar1) |
                      (ulong)(dVar1 - dVar2) & -(ulong)(dVar2 < dVar1))) goto LAB_00142f47;
    }
    this = (Matrix44<double> *)((long)this + 0x20);
    m = (Matrix44<double> *)((long)m + 0x20);
  }
LAB_00142f47:
  return 3 < uVar3;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Matrix44<T>::equalWithAbsError (const Matrix44<T>& m, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
            if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError (
                    (*this).x[i][j], m.x[i][j], e))
                return false;

    return true;
}